

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool __thiscall
cmSetPropertyCommand::InitialPass
          (cmSetPropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  bool bVar1;
  size_type sVar2;
  const_reference __lhs;
  ostream *poVar3;
  reference __lhs_00;
  ulong uVar4;
  allocator<char> local_421;
  string local_420;
  string local_400;
  ostringstream local_3e0 [8];
  ostringstream e_1;
  string *arg;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin1;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_230;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_220;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range1;
  char *sep;
  undefined1 local_208 [4];
  Doing doing;
  ostringstream local_1e8 [8];
  ostringstream e;
  undefined4 local_6c;
  ScopeType scope;
  string *scopeName;
  allocator<char> local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_3_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmSetPropertyCommand *this_local;
  
  local_28 = param_2;
  param_3_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = 0;
  }
  else {
    __lhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)param_3_local);
    bVar1 = std::operator==(__lhs,"GLOBAL");
    if (bVar1) {
      local_6c = 3;
    }
    else {
      bVar1 = std::operator==(__lhs,"DIRECTORY");
      if (bVar1) {
        local_6c = 2;
      }
      else {
        bVar1 = std::operator==(__lhs,"TARGET");
        if (bVar1) {
          local_6c = 0;
        }
        else {
          bVar1 = std::operator==(__lhs,"SOURCE");
          if (bVar1) {
            local_6c = 1;
          }
          else {
            bVar1 = std::operator==(__lhs,"TEST");
            if (bVar1) {
              local_6c = 5;
            }
            else {
              bVar1 = std::operator==(__lhs,"CACHE");
              if (bVar1) {
                local_6c = 4;
              }
              else {
                bVar1 = std::operator==(__lhs,"INSTALL");
                if (!bVar1) {
                  std::__cxx11::ostringstream::ostringstream(local_1e8);
                  poVar3 = std::operator<<((ostream *)local_1e8,"given invalid scope ");
                  poVar3 = std::operator<<(poVar3,(string *)__lhs);
                  poVar3 = std::operator<<(poVar3,".  ");
                  std::operator<<(poVar3,
                                  "Valid scopes are GLOBAL, DIRECTORY, TARGET, SOURCE, TEST, CACHE, INSTALL."
                                 );
                  std::__cxx11::ostringstream::str();
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_208);
                  std::__cxx11::string::~string((string *)local_208);
                  this_local._7_1_ = 0;
                  std::__cxx11::ostringstream::~ostringstream(local_1e8);
                  goto LAB_0035fb38;
                }
                local_6c = 8;
              }
            }
          }
        }
      }
    }
    sep._4_4_ = 1;
    __range1 = (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)0x8b64e0;
    ___begin1 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)param_3_local);
    local_230 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::advance((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)&__begin1,1);
    local_220 = &local_230;
    __end1 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::begin(local_220);
    arg = (string *)
          cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::end(local_220);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&arg), bVar1) {
      __lhs_00 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
      bVar1 = std::operator==(__lhs_00,"PROPERTY");
      if (bVar1) {
        sep._4_4_ = 2;
      }
      else {
        bVar1 = std::operator==(__lhs_00,"APPEND");
        if (bVar1) {
          sep._4_4_ = 0;
          this->AppendMode = true;
          this->Remove = false;
          this->AppendAsString = false;
        }
        else {
          bVar1 = std::operator==(__lhs_00,"APPEND_STRING");
          if (bVar1) {
            sep._4_4_ = 0;
            this->AppendMode = true;
            this->Remove = false;
            this->AppendAsString = true;
          }
          else if (sep._4_4_ == 1) {
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->Names,__lhs_00);
          }
          else if (sep._4_4_ == 2) {
            std::__cxx11::string::operator=((string *)&this->PropertyName,(string *)__lhs_00);
            sep._4_4_ = 3;
          }
          else {
            if (sep._4_4_ != 3) {
              std::__cxx11::ostringstream::ostringstream(local_3e0);
              poVar3 = std::operator<<((ostream *)local_3e0,"given invalid argument \"");
              poVar3 = std::operator<<(poVar3,(string *)__lhs_00);
              std::operator<<(poVar3,"\".");
              std::__cxx11::ostringstream::str();
              cmCommand::SetError(&this->super_cmCommand,&local_400);
              std::__cxx11::string::~string((string *)&local_400);
              this_local._7_1_ = 0;
              std::__cxx11::ostringstream::~ostringstream(local_3e0);
              goto LAB_0035fb38;
            }
            std::__cxx11::string::operator+=((string *)&this->PropertyValue,(char *)__range1);
            __range1 = (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)0x882147;
            std::__cxx11::string::operator+=((string *)&this->PropertyValue,(string *)__lhs_00);
            this->Remove = false;
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      switch(local_6c) {
      case 0:
        this_local._7_1_ = HandleTargetMode(this);
        break;
      case 1:
        this_local._7_1_ = HandleSourceMode(this);
        break;
      case 2:
        this_local._7_1_ = HandleDirectoryMode(this);
        break;
      case 3:
        this_local._7_1_ = HandleGlobalMode(this);
        break;
      case 4:
        this_local._7_1_ = HandleCacheMode(this);
        break;
      case 5:
        this_local._7_1_ = HandleTestMode(this);
        break;
      case 6:
      case 7:
      default:
        this_local._7_1_ = 1;
        break;
      case 8:
        this_local._7_1_ = HandleInstallMode(this);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_420,"not given a PROPERTY <name> argument.",&local_421);
      cmCommand::SetError(&this->super_cmCommand,&local_420);
      std::__cxx11::string::~string((string *)&local_420);
      std::allocator<char>::~allocator(&local_421);
      this_local._7_1_ = 0;
    }
  }
LAB_0035fb38:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmSetPropertyCommand::InitialPass(std::vector<std::string> const& args,
                                       cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // Get the scope on which to set the property.
  std::string const& scopeName = args.front();
  cmProperty::ScopeType scope;
  if (scopeName == "GLOBAL") {
    scope = cmProperty::GLOBAL;
  } else if (scopeName == "DIRECTORY") {
    scope = cmProperty::DIRECTORY;
  } else if (scopeName == "TARGET") {
    scope = cmProperty::TARGET;
  } else if (scopeName == "SOURCE") {
    scope = cmProperty::SOURCE_FILE;
  } else if (scopeName == "TEST") {
    scope = cmProperty::TEST;
  } else if (scopeName == "CACHE") {
    scope = cmProperty::CACHE;
  } else if (scopeName == "INSTALL") {
    scope = cmProperty::INSTALL;
  } else {
    std::ostringstream e;
    e << "given invalid scope " << scopeName << ".  "
      << "Valid scopes are GLOBAL, DIRECTORY, "
         "TARGET, SOURCE, TEST, CACHE, INSTALL.";
    this->SetError(e.str());
    return false;
  }

  // Parse the rest of the arguments up to the values.
  enum Doing
  {
    DoingNone,
    DoingNames,
    DoingProperty,
    DoingValues
  };
  Doing doing = DoingNames;
  const char* sep = "";
  for (std::string const& arg : cmMakeRange(args).advance(1)) {
    if (arg == "PROPERTY") {
      doing = DoingProperty;
    } else if (arg == "APPEND") {
      doing = DoingNone;
      this->AppendMode = true;
      this->Remove = false;
      this->AppendAsString = false;
    } else if (arg == "APPEND_STRING") {
      doing = DoingNone;
      this->AppendMode = true;
      this->Remove = false;
      this->AppendAsString = true;
    } else if (doing == DoingNames) {
      this->Names.insert(arg);
    } else if (doing == DoingProperty) {
      this->PropertyName = arg;
      doing = DoingValues;
    } else if (doing == DoingValues) {
      this->PropertyValue += sep;
      sep = ";";
      this->PropertyValue += arg;
      this->Remove = false;
    } else {
      std::ostringstream e;
      e << "given invalid argument \"" << arg << "\".";
      this->SetError(e.str());
      return false;
    }
  }

  // Make sure a property name was found.
  if (this->PropertyName.empty()) {
    this->SetError("not given a PROPERTY <name> argument.");
    return false;
  }

  // Dispatch property setting.
  switch (scope) {
    case cmProperty::GLOBAL:
      return this->HandleGlobalMode();
    case cmProperty::DIRECTORY:
      return this->HandleDirectoryMode();
    case cmProperty::TARGET:
      return this->HandleTargetMode();
    case cmProperty::SOURCE_FILE:
      return this->HandleSourceMode();
    case cmProperty::TEST:
      return this->HandleTestMode();
    case cmProperty::CACHE:
      return this->HandleCacheMode();
    case cmProperty::INSTALL:
      return this->HandleInstallMode();

    case cmProperty::VARIABLE:
    case cmProperty::CACHED_VARIABLE:
      break; // should never happen
  }
  return true;
}